

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

uint256 * jbcoin::getQualityIndex(uint256 *__return_storage_ptr__,uint256 *uBase,uint64_t uNodeDir)

{
  __uint64_t _Var1;
  iterator pvVar2;
  uint256 *uNode;
  uint64_t uNodeDir_local;
  uint256 *uBase_local;
  
  *(undefined8 *)__return_storage_ptr__->pn = *(undefined8 *)uBase->pn;
  *(undefined8 *)(__return_storage_ptr__->pn + 2) = *(undefined8 *)(uBase->pn + 2);
  *(undefined8 *)(__return_storage_ptr__->pn + 4) = *(undefined8 *)(uBase->pn + 4);
  *(undefined8 *)(__return_storage_ptr__->pn + 6) = *(undefined8 *)(uBase->pn + 6);
  _Var1 = __bswap_64(uNodeDir);
  pvVar2 = base_uint<256UL,_void>::end(__return_storage_ptr__);
  *(__uint64_t *)(pvVar2 + -8) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

uint256
getQualityIndex (uint256 const& uBase, const std::uint64_t uNodeDir)
{
    // Indexes are stored in big endian format: they print as hex as stored.
    // Most significant bytes are first.  Least significant bytes represent
    // adjacent entries.  We place uNodeDir in the 8 right most bytes to be
    // adjacent.  Want uNodeDir in big endian format so ++ goes to the next
    // entry for indexes.
    uint256 uNode (uBase);

    // TODO(tom): there must be a better way.
    // VFALCO [base_uint] This assumes a certain storage format
    ((std::uint64_t*) uNode.end ())[-1] = htobe64 (uNodeDir);

    return uNode;
}